

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O0

FT_Bool tt_face_get_paint(TT_Face face,FT_OpaquePaint opaque_paint,FT_COLR_Paint *paint)

{
  Colr *colr_00;
  undefined1 local_68 [8];
  FT_Matrix ft_root_scale;
  FT_OpaquePaint next_paint;
  Colr *colr;
  FT_COLR_Paint *paint_local;
  TT_Face face_local;
  FT_OpaquePaint opaque_paint_local;
  
  ft_root_scale.yy = (FT_Fixed)opaque_paint.p;
  colr_00 = (Colr *)face->colr;
  if (((colr_00 == (Colr *)0x0) || (colr_00->base_glyphs_v1 == (FT_Byte *)0x0)) ||
     (colr_00->table == (void *)0x0)) {
    opaque_paint_local._15_1_ = 0;
  }
  else if (opaque_paint.insert_root_transform == '\0') {
    opaque_paint_local._15_1_ = read_paint(face,colr_00,(FT_Byte *)ft_root_scale.yy,paint);
  }
  else {
    paint->format = FT_COLR_PAINTFORMAT_TRANSFORM;
    (paint->u).glyph.paint.p = (FT_Byte *)ft_root_scale.yy;
    *(ulong *)&(paint->u).glyph.paint.insert_root_transform = (ulong)next_paint.p._1_7_ << 8;
    local_68 = (undefined1  [8])((((face->root).size)->metrics).x_scale + 0x20 >> 6);
    ft_root_scale.xx = 0;
    ft_root_scale.xy = 0;
    ft_root_scale.yx = (((face->root).size)->metrics).y_scale + 0x20 >> 6;
    if ((((face->root).internal)->transform_flags & 1U) != 0) {
      FT_Matrix_Multiply(&((face->root).internal)->transform_matrix,(FT_Matrix *)local_68);
    }
    (paint->u).transform.affine.xx = (FT_Fixed)local_68;
    (paint->u).transform.affine.xy = ft_root_scale.xx;
    (paint->u).transform.affine.yx = ft_root_scale.xy;
    (paint->u).sweep_gradient.start_angle = ft_root_scale.yx;
    if ((((face->root).internal)->transform_flags & 2U) == 0) {
      (paint->u).linear_gradient.p0.x = 0;
      (paint->u).linear_gradient.p1.y = 0;
    }
    else {
      (paint->u).linear_gradient.p0.x = (((face->root).internal)->transform_delta).x << 10;
      (paint->u).linear_gradient.p1.y = (((face->root).internal)->transform_delta).y << 10;
    }
    opaque_paint_local._15_1_ = 1;
  }
  return opaque_paint_local._15_1_;
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_paint( TT_Face         face,
                     FT_OpaquePaint  opaque_paint,
                     FT_COLR_Paint*  paint )
  {
    Colr*           colr = (Colr*)face->colr;
    FT_OpaquePaint  next_paint;
    FT_Matrix       ft_root_scale;

    if ( !colr || !colr->base_glyphs_v1 || !colr->table )
      return 0;

    if ( opaque_paint.insert_root_transform )
    {
      /* 'COLR' v1 glyph information is returned in unscaled coordinates,
       * i.e., `FT_Size` is not applied or multiplied into the values.  When
       * client applications draw color glyphs, they can request to include
       * a top-level transform, which includes the active `x_scale` and
       * `y_scale` information for scaling the glyph, as well the additional
       * transform and translate configured through `FT_Set_Transform`.
       * This allows client applications to apply this top-level transform
       * to the graphics context first and only once, then have gradient and
       * contour scaling applied correctly when performing the additional
       * drawing operations for subsequenct paints.  Prepare this initial
       * transform here.
       */
      paint->format = FT_COLR_PAINTFORMAT_TRANSFORM;

      next_paint.p                     = opaque_paint.p;
      next_paint.insert_root_transform = 0;
      paint->u.transform.paint         = next_paint;

      /* `x_scale` and `y_scale` are in 26.6 format, representing the scale
       * factor to get from font units to requested size.  However, expected
       * return values are in 16.16, so we shift accordingly with rounding.
       */
      ft_root_scale.xx = ( face->root.size->metrics.x_scale + 32 ) >> 6;
      ft_root_scale.xy = 0;
      ft_root_scale.yx = 0;
      ft_root_scale.yy = ( face->root.size->metrics.y_scale + 32 ) >> 6;

      if ( face->root.internal->transform_flags & 1 )
        FT_Matrix_Multiply( &face->root.internal->transform_matrix,
                            &ft_root_scale );

      paint->u.transform.affine.xx = ft_root_scale.xx;
      paint->u.transform.affine.xy = ft_root_scale.xy;
      paint->u.transform.affine.yx = ft_root_scale.yx;
      paint->u.transform.affine.yy = ft_root_scale.yy;

      /* The translation is specified in 26.6 format and, according to the
       * documentation of `FT_Set_Translate`, is performed on the character
       * size given in the last call to `FT_Set_Char_Size`.  The
       * 'PaintTransform' paint table's `FT_Affine23` format expects
       * values in 16.16 format, thus we need to shift by 10 bits.
       */
      if ( face->root.internal->transform_flags & 2 )
      {
        paint->u.transform.affine.dx =
          face->root.internal->transform_delta.x * ( 1 << 10 );
        paint->u.transform.affine.dy =
          face->root.internal->transform_delta.y * ( 1 << 10 );
      }
      else
      {
        paint->u.transform.affine.dx = 0;
        paint->u.transform.affine.dy = 0;
      }

      return 1;
    }

    return read_paint( face, colr, opaque_paint.p, paint );
  }